

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

wchar_t variance(wchar_t *nums,wchar_t size,_Bool unbiased,_Bool of_mean,my_rational *frac)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint uVar3;
  wchar_t wVar4;
  uint uVar5;
  my_rational mVar6;
  size_t sVar7;
  uint16_t local_f4 [4];
  uint16_t qcpy [6];
  uint16_t tmp [8];
  uint16_t a2 [4];
  uint16_t a [2];
  wchar_t local_bc;
  uint16_t carry;
  _Bool over;
  wchar_t i;
  wchar_t norm;
  uint var;
  my_rational part;
  my_rational f;
  uint16_t local_98;
  uint16_t w [3];
  uint16_t nm [2];
  uint16_t sz [2];
  uint16_t r2 [6];
  uint16_t r1 [6];
  uint16_t r0 [8];
  uint16_t q [8];
  uint16_t sqs [8];
  uint16_t sn [4];
  uint16_t sp [4];
  uint16_t ss [6];
  uint abs_int_min;
  my_rational *frac_local;
  _Bool of_mean_local;
  _Bool unbiased_local;
  wchar_t size_local;
  wchar_t *nums_local;
  
  if (size < L'\x02') {
    if (frac != (my_rational *)0x0) {
      mVar6 = my_rational_construct(0,1);
      *frac = mVar6;
    }
    nums_local._4_4_ = L'\0';
  }
  else {
    uVar3 = size - (uint)unbiased;
    zer_u16n(sp,6);
    zer_u16n(sn,4);
    zer_u16n(sqs + 4,4);
    for (local_bc = L'\0'; local_bc < size; local_bc = local_bc + L'\x01') {
      if (nums[local_bc] != L'\0') {
        if (nums[local_bc] < L'\x01') {
          if (nums[local_bc] < L'\0') {
            _Var1 = ini_u16n(a2,2,0x80000000 - (nums[local_bc] + L'\x80000000'));
            if (_Var1) {
              __assert_fail("!over",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                            ,0x625,
                            "int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
            }
            uVar2 = addip_u16n(sqs + 4,a2,4,2);
            if (uVar2 != 0) {
              __assert_fail("carry == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                            ,0x626,
                            "int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
            }
          }
        }
        else {
          _Var1 = ini_u16n(a2,2,nums[local_bc]);
          if (_Var1) {
            __assert_fail("!over",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x622,
                          "int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
          }
          uVar2 = addip_u16n(sn,a2,4,2);
          if (uVar2 != 0) {
            __assert_fail("carry == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x623,
                          "int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
          }
        }
        _Var1 = mul_u16n(tmp + 6,a2,a2,4,2,2);
        if (_Var1) {
          __assert_fail("!over",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x628,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
        uVar2 = addip_u16n(sp,tmp + 6,6,4);
        if (uVar2 != 0) {
          __assert_fail("carry == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x629,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
      }
    }
    wVar4 = cmp_u16n(sn,sqs + 4,4,4);
    if (wVar4 < L'\0') {
      subip_u16n(sqs + 4,sn,4,4);
      _Var1 = mul_u16n(q + 4,sqs + 4,sqs + 4,8,4,4);
      if (_Var1) {
        __assert_fail("!over",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x631,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
    }
    else {
      subip_u16n(sn,sqs + 4,4,4);
      _Var1 = mul_u16n(q + 4,sn,sn,8,4,4);
      if (_Var1) {
        __assert_fail("!over",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x62e,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
    }
    _Var1 = ini_u16n(w + 1,2,size);
    if (_Var1) {
      __assert_fail("!over",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x633,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    wVar4 = div_u16n(r0 + 4,r1 + 2,(uint16_t *)((long)&f.n + 2),q + 4,w + 1,8,8,2);
    if (wVar4 != L'\0') {
      __assert_fail("i == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x636,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    sVar7 = msb_u16n(r1 + 2,8);
    if (sVar7 != 0) {
      _Var1 = ini_u16n(qcpy + 2,2,1);
      if (_Var1) {
        __assert_fail("!over",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x640,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      addip_u16n(r0 + 4,qcpy + 2,8,2);
      for (local_bc = 0; local_bc < 8; local_bc = local_bc + 1) {
        qcpy[(long)local_bc + 2] = r1[(long)local_bc + 2];
      }
      _Var1 = ini_u16n(r1 + 2,8,size);
      if (_Var1) {
        __assert_fail("!over",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x645,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      wVar4 = cmp_u16n(r1 + 2,qcpy + 2,8,8);
      if (wVar4 < L'\x01') {
        __assert_fail("cmp_u16n(r0, tmp, N_ELEMENTS(r0), N_ELEMENTS(tmp)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x646,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
      subip_u16n(r1 + 2,qcpy + 2,8,8);
    }
    wVar4 = cmp_u16n(sp,r0 + 4,6,8);
    if (wVar4 < L'\0') {
      __assert_fail("cmp_u16n(ss, q, N_ELEMENTS(ss), N_ELEMENTS(q)) >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x649,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    subip_u16n(sp,r0 + 4,6,8);
    _Var1 = ini_u16n(&local_98,2,uVar3);
    if (_Var1) {
      __assert_fail("!over",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x64b,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    wVar4 = div_u16n(r0 + 4,r2 + 2,(uint16_t *)((long)&f.n + 2),sp,&local_98,6,6,2);
    if (wVar4 != L'\0') {
      __assert_fail("i == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x64e,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
    }
    if (of_mean) {
      for (local_bc = 0; local_bc < 6; local_bc = local_bc + 1) {
        local_f4[local_bc] = r0[(long)local_bc + 4];
      }
      wVar4 = div_u16n(r0 + 4,nm,(uint16_t *)((long)&f.n + 2),local_f4,w + 1,6,6,2);
      if (wVar4 != L'\0') {
        __assert_fail("i == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x657,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)");
      }
    }
    sVar7 = msb_u16n(r0 + 4,6);
    if (sVar7 < 0x21) {
      i = ext_u16n(r0 + 4,6);
      if ((uint)i < 0x80000000) {
        wVar4 = cmp_u16n(w + 1,r1 + 2,2,8);
        if (wVar4 < L'\x01') {
          __assert_fail("cmp_u16n(sz, r0, N_ELEMENTS(sz), N_ELEMENTS(r0)) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x66f,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
        wVar4 = cmp_u16n(&local_98,r2 + 2,2,6);
        if (wVar4 < L'\x01') {
          __assert_fail("cmp_u16n(nm, r1, N_ELEMENTS(nm), N_ELEMENTS(r1)) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x670,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
        if ((of_mean) && (wVar4 = cmp_u16n(w + 1,nm,2,6), wVar4 < L'\x01')) {
          __assert_fail("!of_mean || cmp_u16n(sz, r2, N_ELEMENTS(sz), N_ELEMENTS(r2)) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x671,"int variance(const int *, int, _Bool, _Bool, struct my_rational *)")
          ;
        }
        uVar5 = ext_u16n(r1 + 2,8);
        part = my_rational_construct(uVar5,size);
        _norm = my_rational_construct(1,uVar3);
        part = my_rational_product(&part,(my_rational *)&norm);
        uVar5 = ext_u16n(r2 + 2,6);
        _norm = my_rational_construct(uVar5,uVar3);
        part = my_rational_sum(&part,(my_rational *)&norm);
        if (of_mean) {
          _norm = my_rational_construct(1,size);
          part = my_rational_product(&part,(my_rational *)&norm);
          uVar3 = ext_u16n(nm,6);
          _norm = my_rational_construct(uVar3,size);
          part = my_rational_sum(&part,(my_rational *)&norm);
        }
        if (frac == (my_rational *)0x0) {
          if ((part.d + 1 >> 1 <= part.n) && ((uint)i < 0x7fffffff)) {
            i = i + L'\x01';
          }
        }
        else {
          *frac = part;
        }
        nums_local._4_4_ = i;
      }
      else {
        if (frac != (my_rational *)0x0) {
          mVar6 = my_rational_construct(0,1);
          *frac = mVar6;
        }
        nums_local._4_4_ = L'\x7fffffff';
      }
    }
    else {
      if (frac != (my_rational *)0x0) {
        mVar6 = my_rational_construct(0,1);
        *frac = mVar6;
      }
      nums_local._4_4_ = L'\x7fffffff';
    }
  }
  return nums_local._4_4_;
}

Assistant:

int variance(const int *nums, int size, bool unbiased, bool of_mean,
		struct my_rational *frac)
{
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
	/* Holds the absolute value of INT_MIN in an unsigned int. */
	unsigned int abs_int_min = (unsigned int)(-(INT_MIN + 1)) + 1;
	/*
	 * The unbiased variance estimator, sum((nums[i] - sum(nums[i]) /
	 * size)^2) / (size - 1), is equivalent to (sum(nums[i]^2) -
	 * (sum(nums[i]))^2 / size) / (size - 1).  Store sum(nums[i]^2) in
	 * ss, the positive contributions to sum(nums[i]) in sp, and the
	 * negative contributions to sum(nums[i]) in sn.
	 */
	uint16_t ss[3 * MP_DIGITS], sp[2 * MP_DIGITS], sn[2 * MP_DIGITS];
	uint16_t sqs[4 * MP_DIGITS];
	uint16_t q[4 * MP_DIGITS], r0[4 * MP_DIGITS], r1[3 * MP_DIGITS];
	uint16_t r2[3 * MP_DIGITS];
	uint16_t sz[MP_DIGITS], nm[MP_DIGITS], w[MP_DIGITS + 1];
	struct my_rational f, part;
	unsigned int var;
	int norm, i;
	/*
	 * Avoid compiler warnings about set but unused variables when
	 * assertions are stripped.
	 */
#ifndef NDEBUG
	bool over;
#define CHECK_OVERFLOW(x) over = x; assert(!over)
	uint16_t carry;
#define CHECK_CARRY(x) carry = x; assert(carry == 0)
#else
#define CHECK_OVERFLOW(x) x
#define CHECK_CARRY(x) x
#endif

	if (size <= 1) {
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return 0;
	}

	norm = size - ((unbiased) ? 1 : 0);
	zer_u16n(ss, N_ELEMENTS(ss));
	zer_u16n(sp, N_ELEMENTS(sp));
	zer_u16n(sn, N_ELEMENTS(sn));

	for (i = 0; i < size; ++i) {
		uint16_t a[MP_DIGITS], a2[2 * MP_DIGITS];

		if (nums[i] == 0) {
			continue;
		}
		if (nums[i] > 0) {
			CHECK_OVERFLOW(ini_u16n(a, N_ELEMENTS(a), nums[i]));
			CHECK_CARRY(addip_u16n(sp, a, N_ELEMENTS(sp), N_ELEMENTS(a)));
		} else if (nums[i] < 0) {
			CHECK_OVERFLOW(ini_u16n(a, N_ELEMENTS(a), abs_int_min - (unsigned int)(nums[i] - INT_MIN)));
			CHECK_CARRY(addip_u16n(sn, a, N_ELEMENTS(sn), N_ELEMENTS(a)));
		}
		CHECK_OVERFLOW(mul_u16n(a2, a, a, N_ELEMENTS(a2), N_ELEMENTS(a), N_ELEMENTS(a)));
		CHECK_CARRY(addip_u16n(ss, a2, N_ELEMENTS(ss), N_ELEMENTS(a2)));
	}

	if (cmp_u16n(sp, sn, N_ELEMENTS(sp), N_ELEMENTS(sn)) >= 0) {
		subip_u16n(sp, sn, N_ELEMENTS(sp), N_ELEMENTS(sn));
		CHECK_OVERFLOW(mul_u16n(sqs, sp, sp, N_ELEMENTS(sqs), N_ELEMENTS(sp), N_ELEMENTS(sp)));
	} else {
		subip_u16n(sn, sp, N_ELEMENTS(sn), N_ELEMENTS(sp));
		CHECK_OVERFLOW(mul_u16n(sqs, sn, sn, N_ELEMENTS(sqs), N_ELEMENTS(sn), N_ELEMENTS(sn)));
	}
	CHECK_OVERFLOW(ini_u16n(sz, N_ELEMENTS(sz), size));
	i = div_u16n(q, r0, w, sqs, sz, N_ELEMENTS(q), N_ELEMENTS(sqs),
		N_ELEMENTS(sz));
	assert(i == 0);
	if (msb_u16n(r0, N_ELEMENTS(r0)) > 0) {
		/*
		 * Since this remainder is subtracted, add one to the
		 * quotient and convert the remainder to size - r0.  That way
		 * later calculations can treat it as a non-negative term, like
		 * the other fractional parts.
		 */
		uint16_t tmp[4 * MP_DIGITS];

		CHECK_OVERFLOW(ini_u16n(tmp, MP_DIGITS, 1));
		addip_u16n(q, tmp, N_ELEMENTS(q), MP_DIGITS);
		for (i = 0; i < (int)(N_ELEMENTS(r0)); ++i) {
			tmp[i] = r0[i];
		}
		CHECK_OVERFLOW(ini_u16n(r0, N_ELEMENTS(r0), size));
		assert(cmp_u16n(r0, tmp, N_ELEMENTS(r0), N_ELEMENTS(tmp)) > 0);
		subip_u16n(r0, tmp, N_ELEMENTS(r0), N_ELEMENTS(tmp));
	}
	assert(cmp_u16n(ss, q, N_ELEMENTS(ss), N_ELEMENTS(q)) >= 0);
	subip_u16n(ss, q, N_ELEMENTS(ss), N_ELEMENTS(q));
	CHECK_OVERFLOW(ini_u16n(nm, N_ELEMENTS(nm), norm));
	i = div_u16n(q, r1, w, ss, nm, 3 * MP_DIGITS, N_ELEMENTS(ss),
		N_ELEMENTS(nm));
	assert(i == 0);
	if (of_mean) {
		uint16_t qcpy[3 * MP_DIGITS];

		for (i = 0; i < (int)(N_ELEMENTS(qcpy)); ++i) {
			qcpy[i] = q[i];
		}
		i = div_u16n(q, r2, w, qcpy, sz, 3 * MP_DIGITS,
			N_ELEMENTS(qcpy), N_ELEMENTS(sz));
		assert(i == 0);
	}
	if (msb_u16n(q, 3 * MP_DIGITS) > CHAR_BIT * sizeof(unsigned int)) {
		/* Variance is greater than UINT_MAX. */
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return INT_MAX;
	}
	var = ext_u16n(q, 3 * MP_DIGITS);
	if (var > INT_MAX) {
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return INT_MAX;
	}
	/*
	 * Account for the fractional part.  If of_mean is false, that is
	 * r1 / norm + r0 / (size * norm).  If of_mean is true,
	 * that is r2 / size + r1 / (size * norm) + r0 /
	 * (size * size * norm).  Since 0 <= r0 < size,
	 * 0 <= r1 < norm, and 0 <= r2 < size, the total of the fractional
	 * terms is greater than or equal to zero and less than one.
	 */
	assert(cmp_u16n(sz, r0, N_ELEMENTS(sz), N_ELEMENTS(r0)) > 0);
	assert(cmp_u16n(nm, r1, N_ELEMENTS(nm), N_ELEMENTS(r1)) > 0);
	assert(!of_mean || cmp_u16n(sz, r2, N_ELEMENTS(sz), N_ELEMENTS(r2)) > 0);
	f = my_rational_construct(ext_u16n(r0, N_ELEMENTS(r0)), size);
	part = my_rational_construct(1, norm);
	f = my_rational_product(&f, &part);
	part = my_rational_construct(ext_u16n(r1, N_ELEMENTS(r1)), norm);
	f = my_rational_sum(&f, &part);
	if (of_mean) {
		part = my_rational_construct(1, size);
		f = my_rational_product(&f, &part);
		part = my_rational_construct(ext_u16n(r2, N_ELEMENTS(r2)), size);
		f = my_rational_sum(&f, &part);
	}
	if (frac) {
		*frac = f;
	} else {
		/* Round to nearest. */
		if (f.n >= (f.d + 1) / 2 && var < INT_MAX) {
			++var;
		}
	}

	return var;
#undef MP_DIGITS
#undef CHECK_CARRY
#undef CHECK_OVERFLOW
}